

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

void handle_first_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                       cio_error err,size_t bytes_transferred)

{
  cio_buffered_stream *buffered_stream;
  size_t bytes_transferred_local;
  cio_error err_local;
  cio_write_buffer *buffer_local;
  void *handler_context_local;
  cio_io_stream *io_stream_local;
  
  if (err == CIO_SUCCESS) {
    if (bytes_transferred == (buffer->data).element.length) {
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),0);
    }
    else {
      handle_partial_writes
                ((cio_buffered_stream *)handler_context,io_stream,buffer,bytes_transferred);
    }
  }
  else {
    (**(code **)((long)handler_context + 0x38))
              (handler_context,*(undefined8 *)((long)handler_context + 0x40),err);
  }
  return;
}

Assistant:

static void handle_first_write(struct cio_io_stream *io_stream, void *handler_context, struct cio_write_buffer *buffer, enum cio_error err, size_t bytes_transferred)
{
	struct cio_buffered_stream *buffered_stream = handler_context;
	if (cio_unlikely(err != CIO_SUCCESS)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	if (cio_likely(bytes_transferred == buffer->data.head.total_length)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	handle_partial_writes(buffered_stream, io_stream, buffer, bytes_transferred);
}